

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedStringFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
  io::Printer::Indent(printer);
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this->descriptor_,(this->super_FieldGenerator).options_,false,&this->variables_,
               "this->$name$(i).data(), this->$name$(i).length(),\n",printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "  target = ::google::protobuf::internal::WireFormatLite::\n    Write$declared_type$ToArray($number$, this->$name$(i), target);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  printer->Print(variables_,
    "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
  printer->Indent();
  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, false, variables_,
        "this->$name$(i).data(), this->$name$(i).length(),\n", printer);
  }
  printer->Outdent();
  printer->Print(variables_,
    "  target = ::google::protobuf::internal::WireFormatLite::\n"
    "    Write$declared_type$ToArray($number$, this->$name$(i), target);\n"
    "}\n");
}